

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

void check_call(wasm_func_t *func,int32_t arg1,int32_t arg2,int32_t expected)

{
  long lVar1;
  undefined1 local_58 [8];
  wasm_val_t results [1];
  wasm_val_t args [2];
  int32_t expected_local;
  int32_t arg2_local;
  int32_t arg1_local;
  wasm_func_t *func_local;
  
  results[0].of.i32._0_1_ = 0;
  lVar1 = wasm_func_call(func,&results[0].of,local_58);
  if ((lVar1 == 0) && (results[0]._0_4_ == expected)) {
    return;
  }
  printf("> Error on result\n");
  exit(1);
}

Assistant:

void check_call(wasm_func_t* func, int32_t arg1, int32_t arg2, int32_t expected) {
  wasm_val_t args[2] = {
    {.kind = WASM_I32, .of = {.i32 = arg1}},
    {.kind = WASM_I32, .of = {.i32 = arg2}}
  };
  wasm_val_t results[1];
  if (wasm_func_call(func, args, results) || results[0].of.i32 != expected) {
    printf("> Error on result\n");
    exit(1);
  }
}